

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

undefined4 __thiscall
testing::internal::FunctionMockerBase<TestColumnSizeHandler_()>::PerformDefaultAction
          (FunctionMockerBase<TestColumnSizeHandler_()> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<TestColumnSizeHandler_()> *this_00;
  pointer pcVar1;
  char cVar2;
  undefined4 uVar3;
  Action<TestColumnSizeHandler_()> *this_01;
  runtime_error *this_02;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  string message;
  undefined **local_58;
  undefined8 local_50;
  undefined *local_48 [2];
  string *local_38;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = call_description;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0017768a;
    this_00 = (OnCallSpec<TestColumnSizeHandler_()> *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    local_50 = 0;
    local_58 = &PTR__MatchResultListener_002882b0;
    cVar2 = (**(code **)(**(long **)(this_00 + 0x20) + 0x20))
                      (*(long **)(this_00 + 0x20),args,&local_58);
  } while (cVar2 == '\0');
  if (this_00 == (OnCallSpec<TestColumnSizeHandler_()> *)0x0) {
LAB_0017768a:
    pcVar1 = (local_38->_M_dataplus)._M_p;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + local_38->_M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    if (DefaultValue<TestColumnSizeHandler>::value_ == (undefined4 *)0x0) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)&local_58);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = *DefaultValue<TestColumnSizeHandler>::value_;
    if (local_58 != local_48) {
      operator_delete(local_58,(ulong)(local_48[0] + 1));
    }
  }
  else {
    this_01 = OnCallSpec<TestColumnSizeHandler_()>::GetAction(this_00);
    uVar3 = Action<TestColumnSizeHandler_()>::Perform(this_01,args);
  }
  return uVar3;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }